

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc-threshold.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint number;
  ushort **ppuVar2;
  size_t sVar3;
  long lVar4;
  testcase_t testcase;
  xc_values_type *pxVar5;
  double *pdVar6;
  size_t nfail;
  long lVar7;
  int iVar8;
  byte bVar9;
  double dVar10;
  int nspin;
  xc_values_type values;
  double adStack_30d8 [777];
  double local_1890;
  double local_1888;
  int local_187c;
  char *local_1878;
  xc_values_type local_1870;
  
  bVar9 = 0;
  if (argc == 2) {
    ppuVar2 = __ctype_b_loc();
    pcVar1 = argv[1];
    if ((*(byte *)((long)*ppuVar2 + (long)*pcVar1 * 2 + 1) & 4) == 0) {
      number = atoi(pcVar1);
    }
    else {
      number = xc_functional_get_number(pcVar1);
    }
    local_1878 = xc_functional_get_name(number);
    printf("Functional id %i : %s\n",(ulong)number,local_1878);
    local_1890 = 1.0;
    while( true ) {
      testcase = ATOMIC_UPOL;
      lVar7 = 0;
      do {
        dVar10 = 0.0;
        iVar8 = 999;
        do {
          local_1888 = dVar10;
          dVar10 = exp(dVar10 * 0.025);
          compute_input(&local_1870,&local_187c,testcase,dVar10 * 1e-09);
          pxVar5 = &local_1870;
          pdVar6 = adStack_30d8;
          for (lVar4 = 0x308; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pdVar6 = pxVar5->rho[0];
            pxVar5 = (xc_values_type *)((long)pxVar5 + (ulong)bVar9 * -0x10 + 8);
            pdVar6 = pdVar6 + (ulong)bVar9 * -2 + 1;
          }
          sVar3 = check_xc(local_1890,number,local_187c);
          pcVar1 = local_1878;
          lVar7 = lVar7 + sVar3;
          dVar10 = local_1888 + 1.0;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        testcase = testcase + ATOMIC_POL;
      } while (testcase != NOSUCH_TEST);
      if ((lVar7 != 0) || (local_1890 <= 1e-40)) break;
      local_1890 = local_1890 / 10.0;
    }
    if (local_1890 <= 1e-40) {
      printf("Search capped by set minimum threshold %e.\n",0x37a16c262777579c);
    }
    local_1890 = local_1890 * 10.0;
    local_1888 = get_threshold(number);
    printf("Current default threshold: %e\n");
    printf("Estimated working threshold: %e\n",local_1890);
    if (local_1888 < local_1890) {
      printf("WARNING: FUNCTIONAL THRESHOLD FOR %s (ID = %i) SHOULD BE INCREASED TO %e!\n",
             local_1890,pcVar1,(ulong)number);
    }
    if (local_1890 < local_1888) {
      printf("FUNCTIONAL THRESHOLD FOR %s (ID = %i) COULD BE DECREASED FROM %e TO %e!\n",pcVar1,
             (ulong)number);
    }
    libxc_free(pcVar1);
    iVar8 = 0;
  }
  else {
    printf("Usage:\n%s funct\n",*argv);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int main(int argc, char *argv[]) {
  /* xc values */
  xc_values_type values;
  /* functional id */
  int id;
  /* spin type */
  int nspin;

  /* test case */
  int testcase;
  /* Current threshold */
  double threshold;

  /* logarithmic grid spacing */
  const double h = 0.025;
  /* density at end point */
  const double nmin = 1e-60;
  /* since we use an exponential density with zeta = 1.0, the
     necessary maximal radius is */
  const double rmax = -log(nmin) / 2;
  /* the closest point should be at */
  const double rmin = 1.0e-9;
  /* this leads to the number of radial points as */
  const double nrad = ceil(log(rmax/rmin) / h);

  /* Minimal threshold to check */
  const double min_threshold = 1e-40;

  /* radial point id */
  int irad;
  /* radius */
  double r;
  /* functional name */
  char *fname;

  /* Read in function id */
  if (argc != 2) {
    printf("Usage:\n%s funct\n", argv[0]);
    return 1;
  }

#if 0
  printf("logarithmic spacing h = %e yields %lu radial points\n", h,
         (long unsigned)nrad);
  printf("rmax = %e, nmin = %e\n", rmin*exp(h * (nrad - 1)),
         exp(-2 * rmin * exp(h * (nrad - 1))));
#endif

  /* Is functional defined by a string constant? */
  if (isalpha(argv[1][0]))
    id = xc_functional_get_number(argv[1]);
  else
    id = atoi(argv[1]);

  /* Get functional name */
  fname = xc_functional_get_name(id);
  printf("Functional id %i : %s\n", id, fname);

  /* Initial value for threshold */
  threshold = 1.0;
  while (1) {
    /* Number of failed data points */
    size_t nfail = 0;
    /* Run all test cases for the given threshold */
    for (testcase = 0; testcase < NOSUCH_TEST; testcase++) {
      /* Loop over radius */
      for (irad = 0; irad < nrad; irad++) {
        size_t rfail;
        /* Calculate radius */
        r = rmin*exp(h * irad);
        /* Compute the input data */
        compute_input(&values, &nspin, (testcase_t) testcase, r);
        /* Compute the functional */
        rfail = check_xc(id, nspin, values, threshold);
        nfail += rfail;
#ifdef XC_DEBUG
        if (rfail) {
          printf("%lu failures for %s at r = %e\n", rfail, testcases[testcase],
                 r);
        }
#endif
      }
    }

    if (nfail == 0 && threshold > min_threshold) {
      /* Values are still OK, go further */
      threshold /= 10.0;
    } else {
      if(threshold <= min_threshold) {
        printf("Search capped by set minimum threshold %e.\n", min_threshold);
      }

      /* Working threshold */
      double ok_thresh = threshold * 10.0;
      /* Current threshold */
      double cur_thresh = get_threshold(id);

#ifdef XC_DEBUG
      printf("%lu non-finite values encountered for threshold=%e\n",
             (long unsigned)nfail, threshold);
#endif

      printf("Current default threshold: %e\n", cur_thresh);
      /* We got numerical instabilities, so the threshold is the previous one */
      printf("Estimated working threshold: %e\n", ok_thresh);

      if (cur_thresh < ok_thresh) {
        printf("WARNING: FUNCTIONAL THRESHOLD FOR %s (ID = %i) SHOULD BE "
               "INCREASED TO %e!\n",
               fname, id, ok_thresh);
      }
      if (cur_thresh > ok_thresh) {
        printf("FUNCTIONAL THRESHOLD FOR %s (ID = %i) COULD BE DECREASED FROM "
               "%e TO %e!\n",
               fname, id, cur_thresh, ok_thresh);
      }

      break;
    }
  }

  libxc_free(fname);

  return 0;
}